

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O3

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/SystemUtilsTests.cpp:17:9)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_utilities_SystemUtilsTests_cpp:17:9)>
            *this,ostream *s)

{
  MessageBuilder *this_00;
  MessageBuilder DOCTEST_CAPTURE_5;
  MessageBuilder local_50;
  
  MessageBuilder::MessageBuilder
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/SystemUtilsTests.cpp"
             ,0x11,is_warn);
  local_50.m_stream = s;
  this_00 = MessageBuilder::operator_(&local_50,(char (*) [25])"The \'fixed\' filename is ");
  MessageBuilder::operator_(this_00,(this->lambda_).fixed_filename);
  MessageBuilder::~MessageBuilder(&local_50);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }